

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bundle_adjustment.cc
# Opt level: O0

void __thiscall
sfm::ba::BundleAdjustment::update_parameters(BundleAdjustment *this,DenseVectorType *delta_x)

{
  int iVar1;
  size_type sVar2;
  reference cam;
  double *pdVar3;
  reference out;
  reference pt;
  reference out_00;
  ulong local_30;
  size_t i_1;
  size_t i;
  size_t total_camera_params;
  DenseVectorType *delta_x_local;
  BundleAdjustment *this_local;
  
  i = 0;
  if (((this->opts).bundle_mode & BA_CAMERAS) != 0) {
    for (i_1 = 0; sVar2 = std::vector<sfm::ba::Camera,_std::allocator<sfm::ba::Camera>_>::size
                                    (this->cameras), i_1 < sVar2; i_1 = i_1 + 1) {
      cam = std::vector<sfm::ba::Camera,_std::allocator<sfm::ba::Camera>_>::at(this->cameras,i_1);
      pdVar3 = DenseVector<double>::data(delta_x);
      iVar1 = this->num_cam_params;
      out = std::vector<sfm::ba::Camera,_std::allocator<sfm::ba::Camera>_>::at(this->cameras,i_1);
      update_camera(this,cam,pdVar3 + (long)iVar1 * i_1,out);
    }
    sVar2 = std::vector<sfm::ba::Camera,_std::allocator<sfm::ba::Camera>_>::size(this->cameras);
    i = sVar2 * (long)this->num_cam_params;
  }
  if (((this->opts).bundle_mode & BA_POINTS) != 0) {
    for (local_30 = 0;
        sVar2 = std::vector<sfm::ba::Point3D,_std::allocator<sfm::ba::Point3D>_>::size(this->points)
        , local_30 < sVar2; local_30 = local_30 + 1) {
      pt = std::vector<sfm::ba::Point3D,_std::allocator<sfm::ba::Point3D>_>::at
                     (this->points,local_30);
      pdVar3 = DenseVector<double>::data(delta_x);
      out_00 = std::vector<sfm::ba::Point3D,_std::allocator<sfm::ba::Point3D>_>::at
                         (this->points,local_30);
      update_point(this,pt,pdVar3 + i + local_30 * 3,out_00);
    }
  }
  return;
}

Assistant:

void
BundleAdjustment::update_parameters (DenseVectorType const& delta_x)
{
    /* Update cameras. */
    std::size_t total_camera_params = 0;
    if (this->opts.bundle_mode & BA_CAMERAS)
    {
        for (std::size_t i = 0; i < this->cameras->size(); ++i)
            this->update_camera(this->cameras->at(i),
                delta_x.data() + this->num_cam_params * i,
                &this->cameras->at(i));
        total_camera_params = this->cameras->size() * this->num_cam_params;
    }

    /* Update points. */
    if (this->opts.bundle_mode & BA_POINTS)
    {
        for (std::size_t i = 0; i < this->points->size(); ++i)
            this->update_point(this->points->at(i),
                delta_x.data() + total_camera_params + i * 3,
                &this->points->at(i));
    }
}